

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

void RigidBodyDynamics::SolveConstrainedSystemDirect
               (MatrixNd *H,MatrixNd *G,VectorNd *c,VectorNd *gamma,VectorNd *lambda,MatrixNd *A,
               VectorNd *b,VectorNd *x,LinearSolver *linear_solver)

{
  LinearSolver LVar1;
  double dVar2;
  Scalar *dst_ptr_1;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  Index row;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Index col;
  long lVar9;
  ActualDstType actualDst;
  double *pdVar10;
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> local_121;
  DstEvaluatorType local_120;
  VectorNd *local_108;
  SrcEvaluatorType local_100;
  DstXprType local_f0;
  void *local_b8;
  void *local_a8;
  void *local_98;
  void *local_88;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_50;
  
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (c->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_120.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_data = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_120.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_outerStride.m_value =
       (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_50.m_dstExpr = &local_f0;
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startRow.
  m_value = 0;
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startCol.
  m_value = 0;
  local_100.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
  data = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_100.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
  m_outerStride =
       (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_50.m_src = &local_100;
  local_50.m_dst = &local_120;
  local_50.m_functor = &local_121;
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       local_120.
       super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
       .m_data;
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = local_f0.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
            m_rows.m_value;
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr = A;
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_outerStride
       = local_120.
         super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
         .m_outerStride.m_value;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run(&local_50);
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (c->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (gamma->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  local_120.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_data = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_120.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_outerStride.m_value =
       (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_100.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
  data = (G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_100.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
  m_outerStride =
       (G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if (0 < local_f0.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
          m_rows.m_value) {
    pdVar3 = local_120.
             super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             .m_data + local_120.
                       super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                       .
                       super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_outerStride.m_value *
                       local_f0.
                       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                       .m_cols.m_value;
    lVar9 = 0;
    pdVar10 = local_100.
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
              m_d.data;
    do {
      if (0 < local_f0.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_cols.m_value) {
        lVar6 = 0;
        pdVar5 = pdVar10;
        do {
          pdVar3[lVar6] = *pdVar5;
          lVar6 = lVar6 + 1;
          pdVar5 = pdVar5 + local_100.
                            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                            .m_d.m_outerStride;
        } while (local_f0.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                 .m_cols.m_value != lVar6);
      }
      lVar9 = lVar9 + 1;
      pdVar10 = pdVar10 + 1;
      pdVar3 = pdVar3 + local_120.
                        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                        .
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        .m_outerStride.m_value;
    } while (lVar9 != local_f0.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_rows.m_value);
  }
  local_120.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_data = local_120.
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_data + local_f0.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_cols.m_value;
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startCol.
  m_value = 0;
  local_50.m_dst = &local_120;
  local_50.m_src = &local_100;
  local_50.m_functor = &local_121;
  local_108 = gamma;
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       local_120.
       super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
       .m_data;
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr = A;
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startRow.
  m_value = local_f0.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
            m_cols.m_value;
  local_f0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_outerStride
       = local_120.
         super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
         .m_outerStride.m_value;
  local_50.m_dstExpr = &local_f0;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run(&local_50);
  pdVar10 = (c->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar4 = (c->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  pdVar3 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar7 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1);
    if ((long)uVar4 <= (long)uVar7) {
      uVar7 = uVar4;
    }
    uVar8 = uVar4 - uVar7 & 0xfffffffffffffffe;
    if (0 < (long)uVar7) {
      *pdVar3 = *pdVar10;
    }
    lVar9 = uVar8 + uVar7;
    if (0 < (long)uVar8) {
      do {
        dVar2 = (pdVar10 + uVar7)[1];
        pdVar3[uVar7] = pdVar10[uVar7];
        (pdVar3 + uVar7)[1] = dVar2;
        uVar7 = uVar7 + 2;
      } while ((long)uVar7 < lVar9);
    }
    for (; lVar9 < (long)uVar4; lVar9 = lVar9 + 1) {
      pdVar3[lVar9] = pdVar10[lVar9];
    }
    uVar4 = (c->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    pdVar3 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  }
  else if (0 < (long)uVar4) {
    uVar7 = 0;
    do {
      pdVar3[uVar7] = pdVar10[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  pdVar10 = (local_108->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  uVar7 = (local_108->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  pdVar3 = pdVar3 + uVar4;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar4 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1);
    if ((long)uVar7 <= (long)uVar4) {
      uVar4 = uVar7;
    }
    uVar8 = uVar7 - uVar4 & 0xfffffffffffffffe;
    if (0 < (long)uVar4) {
      *pdVar3 = *pdVar10;
    }
    lVar9 = uVar8 + uVar4;
    if (0 < (long)uVar8) {
      do {
        dVar2 = (pdVar10 + uVar4)[1];
        pdVar3[uVar4] = pdVar10[uVar4];
        (pdVar3 + uVar4)[1] = dVar2;
        uVar4 = uVar4 + 2;
      } while ((long)uVar4 < lVar9);
    }
    for (; lVar9 < (long)uVar7; lVar9 = lVar9 + 1) {
      pdVar3[lVar9] = pdVar10[lVar9];
    }
  }
  else if (0 < (long)uVar7) {
    uVar4 = 0;
    do {
      pdVar3[uVar4] = pdVar10[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar7 != uVar4);
  }
  LVar1 = *linear_solver;
  if (LVar1 == LinearSolverHouseholderQR) {
    Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f0,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
    local_50.m_src = (SrcEvaluatorType *)b;
    local_50.m_dst = (DstEvaluatorType *)&local_f0;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(x,(SrcXprType *)&local_50,(assign_op<double,_double> *)&local_120);
  }
  else if (LVar1 == LinearSolverColPivHouseholderQR) {
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f0,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
    local_50.m_src = (SrcEvaluatorType *)b;
    local_50.m_dst = (DstEvaluatorType *)&local_f0;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(x,(SrcXprType *)&local_50,(assign_op<double,_double> *)&local_120);
    free(local_88);
    free(local_98);
    free(local_a8);
    free(local_b8);
  }
  else {
    if (LVar1 != LinearSolverPartialPivLU) {
      return;
    }
    Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f0,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
    local_50.m_src = (SrcEvaluatorType *)b;
    local_50.m_dst = (DstEvaluatorType *)&local_f0;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(x,(SrcXprType *)&local_50,(assign_op<double,_double> *)&local_120);
  }
  free((void *)local_f0.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               .m_startCol.m_value);
  free(local_f0.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr);
  free(local_f0.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
       m_data);
  return;
}

Assistant:

RBDL_DLLAPI
void SolveConstrainedSystemDirect (
  Math::MatrixNd &H,
  const Math::MatrixNd &G,
  const Math::VectorNd &c,
  const Math::VectorNd &gamma,
  Math::VectorNd &lambda,
  Math::MatrixNd &A,
  Math::VectorNd &b,
  Math::VectorNd &x,
  Math::LinearSolver &linear_solver
)
{
  // Build the system: Copy H
  A.block(0, 0, c.rows(), c.rows()) = H;

  // Copy G and G^T
  A.block(0, c.rows(), c.rows(), gamma.rows()) = G.transpose();
  A.block(c.rows(), 0, gamma.rows(), c.rows()) = G;

  // Build the system: Copy -C + \tau
  b.block(0, 0, c.rows(), 1) = c;
  b.block(c.rows(), 0, gamma.rows(), 1) = gamma;

  LOG << "A = " << std::endl << A << std::endl;
  LOG << "b = " << std::endl << b << std::endl;

#ifdef RBDL_USE_CASADI_MATH
  auto linsol = casadi::Linsol("linear_solver", "symbolicqr", A.sparsity());
  x = linsol.solve(A, b);
#else
  switch (linear_solver) {
  case (LinearSolverPartialPivLU) :
    x = A.partialPivLu().solve(b);
    break;
  case (LinearSolverColPivHouseholderQR) :
    x = A.colPivHouseholderQr().solve(b);
    break;
  case (LinearSolverHouseholderQR) :
    x = A.householderQr().solve(b);
    break;
  default:
    LOG << "Error: Invalid linear solver: " << linear_solver << std::endl;
    assert (0);
    break;
  }
#endif

  LOG << "x = " << std::endl << x << std::endl;
}